

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::RedeferFunctionObjectTypes(FunctionBody *this)

{
  FunctionBody *this_local;
  
  FunctionProxy::MapFunctionObjectTypes<Js::FunctionBody::RedeferFunctionObjectTypes()::__0>
            ((FunctionProxy *)this,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void FunctionBody::RedeferFunctionObjectTypes()
    {
        this->MapFunctionObjectTypes([&](ScriptFunctionType* functionType)
        {
            Assert(functionType->GetTypeId() == TypeIds_Function);

            if (!CrossSite::IsThunk(functionType->GetEntryPoint()))
            {
                functionType->SetEntryPoint(GetScriptContext()->DeferredParsingThunk);
            }
            if (!CrossSite::IsThunk(functionType->GetEntryPointInfo()->jsMethod))
            {
                functionType->GetEntryPointInfo()->jsMethod = GetScriptContext()->DeferredParsingThunk;
            }
        });
    }